

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

XrResult ApiDumpLayerXrUpdateHandMeshMSFT
                   (XrHandTrackerEXT handTracker,XrHandMeshUpdateInfoMSFT *updateInfo,
                   XrHandMeshMSFT *handMesh)

{
  long lVar1;
  bool bVar2;
  XrResult XVar3;
  iterator iVar4;
  invalid_argument *this;
  XrGeneratedDispatchTable *gen_dispatch_table;
  XrHandTrackerEXT handTracker_local;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  string local_358;
  string local_338;
  ostringstream oss_handMesh;
  uint auStack_300 [88];
  ostringstream oss_handTracker;
  uint auStack_188 [88];
  
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  handTracker_local = handTracker;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&oss_handTracker,&g_handtrackerext_dispatch_mutex);
  iVar4 = std::
          _Hashtable<XrHandTrackerEXT_T_*,_std::pair<XrHandTrackerEXT_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrHandTrackerEXT_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrHandTrackerEXT_T_*>,_std::hash<XrHandTrackerEXT_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&g_handtrackerext_dispatch_map._M_h,&handTracker_local);
  if (iVar4.
      super__Node_iterator_base<std::pair<XrHandTrackerEXT_T_*const,_XrGeneratedDispatchTable_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    gen_dispatch_table = (XrGeneratedDispatchTable *)0x0;
  }
  else {
    gen_dispatch_table =
         *(XrGeneratedDispatchTable **)
          ((long)iVar4.
                 super__Node_iterator_base<std::pair<XrHandTrackerEXT_T_*const,_XrGeneratedDispatchTable_*>,_false>
                 ._M_cur + 0x10);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&oss_handTracker);
  if (iVar4.
      super__Node_iterator_base<std::pair<XrHandTrackerEXT_T_*const,_XrGeneratedDispatchTable_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[21],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [9])"XrResult",(char (*) [21])"xrUpdateHandMeshMSFT",
               (char (*) [1])0x20fb54);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_handTracker);
    lVar1 = *(long *)((long)&_oss_handTracker[-1].super___mutex_base._M_mutex + 0x10);
    *(uint *)((long)auStack_188 + lVar1) = *(uint *)((long)auStack_188 + lVar1) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_handTracker);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[17],char_const(&)[12],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [17])"XrHandTrackerEXT",(char (*) [12])"handTracker",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_handMesh);
    std::__cxx11::string::~string((string *)&oss_handMesh);
    std::__cxx11::string::string((string *)&local_338,"updateInfo",(allocator *)&oss_handMesh);
    std::__cxx11::string::string
              ((string *)&local_358,"const XrHandMeshUpdateInfoMSFT*",(allocator *)&local_378);
    bVar2 = ApiDumpOutputXrStruct
                      (gen_dispatch_table,updateInfo,&local_338,&local_358,true,&contents);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_338);
    if (!bVar2) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Invalid Operation");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_handMesh);
    *(uint *)((long)auStack_300 + *(long *)(_oss_handMesh + -0x18)) =
         *(uint *)((long)auStack_300 + *(long *)(_oss_handMesh + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_handMesh);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],char_const(&)[9],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [16])0x214bd3,(char (*) [9])"handMesh",&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_390,&contents);
    ApiDumpLayerRecordContent(&local_390);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_390);
    XVar3 = (*gen_dispatch_table->UpdateHandMeshMSFT)(handTracker_local,updateInfo,handMesh);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_handMesh);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_handTracker);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&contents);
  return XVar3;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrUpdateHandMeshMSFT(
    XrHandTrackerEXT handTracker,
    const XrHandMeshUpdateInfoMSFT* updateInfo,
    XrHandMeshMSFT* handMesh) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_handtrackerext_dispatch_mutex);
            auto map_iter = g_handtrackerext_dispatch_map.find(handTracker);
            if (map_iter == g_handtrackerext_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrUpdateHandMeshMSFT", "");
        std::ostringstream oss_handTracker;
        oss_handTracker << std::hex << reinterpret_cast<const void*>(handTracker);
        contents.emplace_back("XrHandTrackerEXT", "handTracker", oss_handTracker.str());
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, updateInfo, "updateInfo", "const XrHandMeshUpdateInfoMSFT*", true, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::ostringstream oss_handMesh;
        oss_handMesh << std::hex << reinterpret_cast<const void*>(handMesh);
        contents.emplace_back("XrHandMeshMSFT*", "handMesh", oss_handMesh.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->UpdateHandMeshMSFT(handTracker, updateInfo, handMesh);
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}